

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTransport.h
# Opt level: O3

uint32_t duckdb_apache::thrift::transport::readAll<duckdb_apache::thrift::transport::TTransport>
                   (TTransport *trans,uint8_t *buf,uint32_t len)

{
  int iVar1;
  TException *this;
  uint32_t uVar2;
  string local_40;
  
  if (len == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      iVar1 = (*trans->_vptr_TTransport[6])(trans,buf + uVar2,(ulong)(len - uVar2));
      if (iVar1 == 0) {
        this = (TException *)__cxa_allocate_exception(0x30);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"No more data to read.","");
        TException::TException(this,&local_40);
        *(undefined ***)this = &PTR__TException_02477dd8;
        *(undefined4 *)(this + 1) = 3;
        __cxa_throw(this,&TTransportException::typeinfo,TException::~TException);
      }
      uVar2 = uVar2 + iVar1;
    } while (uVar2 < len);
  }
  return uVar2;
}

Assistant:

uint32_t readAll(Transport_& trans, uint8_t* buf, uint32_t len) {
  uint32_t have = 0;
  uint32_t get = 0;

  while (have < len) {
    get = trans.read(buf + have, len - have);
    if (get <= 0) {
      throw TTransportException(TTransportException::END_OF_FILE, "No more data to read.");
    }
    have += get;
  }

  return have;
}